

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O0

void __thiscall
TPZSkylMatrix<long_double>::TPZSkylMatrix
          (TPZSkylMatrix<long_double> *this,TPZSkylMatrix<long_double> *A)

{
  TPZSkylMatrix<long_double> *in_RDI;
  TPZSkylMatrix<long_double> *unaff_retaddr;
  int64_t in_stack_ffffffffffffffb8;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<long_double> *in_stack_ffffffffffffffd0;
  TPZSkylMatrix<long_double> *A_00;
  
  A_00 = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZSkylMatrix<long_double>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZMatrix<long_double>::TPZMatrix
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             &in_RDI->super_TPZMatrix<long_double>);
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSkylMatrix_02414be0;
  TPZVec<long_double_*>::TPZVec((TPZVec<long_double_*> *)in_RDI,in_stack_ffffffffffffffb8);
  TPZVec<long_double>::TPZVec((TPZVec<long_double> *)in_RDI,(int64_t)&in_RDI->fStorage);
  Copy(unaff_retaddr,A_00);
  return;
}

Assistant:

TPZSkylMatrix(const TPZSkylMatrix<TVar> &A ) : TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>(A), fElem(0), fStorage(0)  { Copy(A); }